

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_node.cpp
# Opt level: O1

void duckdb::BaseNode<(unsigned_char)'\x10',_(duckdb::NType)4>::InsertChildInternal
               (BaseNode<(unsigned_char)__x10_,_(duckdb::NType)4> *n,uint8_t byte,Node child)

{
  byte bVar1;
  ulong uVar2;
  byte bVar3;
  ulong uVar4;
  uint uVar5;
  
  bVar1 = n->count;
  uVar4 = (ulong)bVar1;
  uVar2 = 0;
  if (uVar4 != 0) {
    do {
      if (byte <= n->key[uVar2]) goto LAB_00c2d430;
      uVar2 = uVar2 + 1;
    } while (bVar1 != (byte)uVar2);
    uVar2 = (ulong)bVar1;
  }
LAB_00c2d430:
  bVar3 = bVar1;
  while ((byte)uVar2 < bVar3) {
    uVar5 = (int)uVar4 - 1;
    n->key[uVar4] = n->key[uVar5];
    n->children[uVar4].super_IndexPointer.data = n->children[uVar5].super_IndexPointer.data;
    uVar4 = uVar4 - 1;
    bVar3 = (byte)uVar4;
  }
  n->key[uVar2 & 0xff] = byte;
  n->children[uVar2 & 0xff].super_IndexPointer.data = (idx_t)child.super_IndexPointer.data;
  n->count = bVar1 + 1;
  return;
}

Assistant:

void BaseNode<CAPACITY, TYPE>::InsertChildInternal(BaseNode &n, const uint8_t byte, const Node child) {
	// Still space. Insert the child.
	uint8_t child_pos = 0;
	while (child_pos < n.count && n.key[child_pos] < byte) {
		child_pos++;
	}

	// Move children backwards to make space.
	for (uint8_t i = n.count; i > child_pos; i--) {
		n.key[i] = n.key[i - 1];
		n.children[i] = n.children[i - 1];
	}

	n.key[child_pos] = byte;
	n.children[child_pos] = child;
	n.count++;
}